

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphviz.cpp
# Opt level: O0

ostream * ccs::operator<<(ostream *os,Dumper *dagDumper)

{
  Style local_a0;
  Streamer local_70 [2];
  undefined1 local_50 [8];
  unordered_set<const_ccs::Node_*,_std::hash<const_ccs::Node_*>,_std::equal_to<const_ccs::Node_*>,_std::allocator<const_ccs::Node_*>_>
  visited;
  Dumper *dagDumper_local;
  ostream *os_local;
  
  visited._M_h._M_single_bucket = (__node_base_ptr)dagDumper;
  std::
  unordered_set<const_ccs::Node_*,_std::hash<const_ccs::Node_*>,_std::equal_to<const_ccs::Node_*>,_std::allocator<const_ccs::Node_*>_>
  ::unordered_set((unordered_set<const_ccs::Node_*,_std::hash<const_ccs::Node_*>,_std::equal_to<const_ccs::Node_*>,_std::allocator<const_ccs::Node_*>_>
                   *)local_50);
  std::operator<<(os,"digraph {");
  std::operator<<(os,"edge [arrowhead = none]");
  Dumper::graphStyle_abi_cxx11_(&local_a0,(Dumper *)visited._M_h._M_single_bucket);
  anon_unknown_1::Streamer::Streamer(local_70,&local_a0,true);
  anon_unknown_1::operator<<(os,local_70);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map(&local_a0);
  anon_unknown_1::visit
            ((Dumper *)visited._M_h._M_single_bucket,os,
             (unordered_set<const_ccs::Node_*,_std::hash<const_ccs::Node_*>,_std::equal_to<const_ccs::Node_*>,_std::allocator<const_ccs::Node_*>_>
              *)local_50,(Node *)visited._M_h._M_single_bucket[1]._M_nxt);
  std::operator<<(os,"}");
  std::
  unordered_set<const_ccs::Node_*,_std::hash<const_ccs::Node_*>,_std::equal_to<const_ccs::Node_*>,_std::allocator<const_ccs::Node_*>_>
  ::~unordered_set((unordered_set<const_ccs::Node_*,_std::hash<const_ccs::Node_*>,_std::equal_to<const_ccs::Node_*>,_std::allocator<const_ccs::Node_*>_>
                    *)local_50);
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const Dumper &dagDumper) {
  std::unordered_set<const Node *> visited;

  os << "digraph {";
  os << "edge [arrowhead = none]";
  os << Streamer(dagDumper.graphStyle(), true);

  visit(dagDumper, os, visited, dagDumper.node_);

  os << "}";

  return os;
}